

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void rsg::copyVarying<64>(ValueAccess dst,ConstStridedValueAccess<64> src,int compNdx)

{
  Scalar SVar1;
  TestError *this;
  int elemNdx;
  int compNdx_00;
  ConstStridedValueAccess<64> CVar2;
  StridedValueAccess<1> SVar3;
  ValueAccess dst_local;
  ConstStridedValueAccess<64> src_local;
  
  dst_local.super_ConstStridedValueAccess<1>.m_value = dst.super_ConstStridedValueAccess<1>.m_value;
  dst_local.super_ConstStridedValueAccess<1>.m_type = dst.super_ConstStridedValueAccess<1>.m_type;
  src_local.m_value = src.m_value;
  src_local.m_type = src.m_type;
  if ((dst_local.super_ConstStridedValueAccess<1>.m_type)->m_baseType == TYPE_FLOAT) {
    for (compNdx_00 = 0;
        compNdx_00 < (dst_local.super_ConstStridedValueAccess<1>.m_type)->m_numElements;
        compNdx_00 = compNdx_00 + 1) {
      CVar2 = ConstStridedValueAccess<64>::component(&src_local,compNdx_00);
      SVar1 = CVar2.m_value[compNdx];
      SVar3 = StridedValueAccess<1>::component(&dst_local,compNdx_00);
      *SVar3.super_ConstStridedValueAccess<1>.m_value = SVar1;
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0xa2);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void copyVarying (ValueAccess dst, ConstStridedValueAccess<Stride> src, int compNdx)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
		dst.component(elemNdx).asFloat() = src.component(elemNdx).asFloat(compNdx);
}